

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_>::~TPZFrontMatrix
          (TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_> *this,void **vtt
          )

{
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  TPZVec<int>::~TPZVec(&this->fNumElConnectedBackup);
  TPZVec<int>::~TPZVec(&this->fNumElConnected);
  TPZFrontNonSym<float>::~TPZFrontNonSym(&this->fFront);
  TPZStackEqnStorage<float>::~TPZStackEqnStorage(&this->fStorage);
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::~TPZFrontMatrix(){
}